

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_2a1b1f::ComboDescriptor::MakeScripts
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,ComboDescriptor *this,
          vector<CPubKey,_std::allocator<CPubKey>_> *keys,Span<const_CScript> param_2,
          FlatSigningProvider *out)

{
  long in_FS_OFFSET;
  CScript p2wpkh;
  CKeyID id;
  void *local_dc;
  uchar auStack_d4 [8];
  uchar local_cc [4];
  direct_or_indirect local_c8;
  uint local_ac;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_a8;
  undefined1 local_60;
  direct_or_indirect local_58;
  uint local_3c;
  CKeyID local_34;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CPubKey::GetID(&local_34,
                 (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                 super__Vector_impl_data._M_start);
  std::
  _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
  ::_M_emplace_unique<CKeyID&,CPubKey_const&>
            ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
              *)&out->pubkeys,&local_34,
             (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
             super__Vector_impl_data._M_start);
  GetScriptForRawPubKey
            ((CScript *)&local_a8._M_first,
             (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
            (__return_storage_ptr__,(CScript *)&local_a8._M_first);
  if (0x1c < (uint)local_a8._28_4_) {
    free((void *)local_a8._0_8_);
    local_a8._0_8_ = (void *)0x0;
  }
  PKHash::PKHash((PKHash *)&local_c8.indirect_contents,&local_34);
  local_a8._16_4_ = local_c8._16_4_;
  local_a8._0_8_ = local_c8.indirect_contents.indirect;
  local_a8._8_8_ = local_c8._8_8_;
  local_60 = 2;
  GetScriptForDestination
            ((CScript *)&local_58.indirect_contents,(CTxDestination *)&local_a8._M_first);
  std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
            (__return_storage_ptr__,(CScript *)&local_58.indirect_contents);
  if (0x1c < local_3c) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_a8._M_first);
  if ((((keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
        super__Vector_impl_data._M_start)->vch[0] & 0xfe) == 2) {
    local_a8._M_first._M_storage._M_storage[0x10] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[0x10];
    local_a8._M_first._M_storage._M_storage[0x11] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[0x11];
    local_a8._M_first._M_storage._M_storage[0x12] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[0x12];
    local_a8._M_first._M_storage._M_storage[0x13] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[0x13];
    local_a8._M_first._M_storage._M_storage[0] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[0];
    local_a8._M_first._M_storage._M_storage[1] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[1];
    local_a8._M_first._M_storage._M_storage[2] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[2];
    local_a8._M_first._M_storage._M_storage[3] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[3];
    local_a8._M_first._M_storage._M_storage[4] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[4];
    local_a8._M_first._M_storage._M_storage[5] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[5];
    local_a8._M_first._M_storage._M_storage[6] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[6];
    local_a8._M_first._M_storage._M_storage[7] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[7];
    local_a8._M_first._M_storage._M_storage[8] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[8];
    local_a8._M_first._M_storage._M_storage[9] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[9];
    local_a8._M_first._M_storage._M_storage[10] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[10];
    local_a8._M_first._M_storage._M_storage[0xb] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[0xb];
    local_a8._M_first._M_storage._M_storage[0xc] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[0xc];
    local_a8._M_first._M_storage._M_storage[0xd] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[0xd];
    local_a8._M_first._M_storage._M_storage[0xe] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[0xe];
    local_a8._M_first._M_storage._M_storage[0xf] =
         local_34.super_uint160.super_base_blob<160U>.m_data._M_elems[0xf];
    local_60 = 5;
    GetScriptForDestination
              ((CScript *)&local_58.indirect_contents,(CTxDestination *)&local_a8._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_a8._M_first);
    CScriptID::CScriptID((CScriptID *)&local_a8._M_first,(CScript *)&local_58.indirect_contents);
    std::
    _Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
    ::_M_emplace_unique<CScriptID,CScript&>
              ((_Rb_tree<CScriptID,std::pair<CScriptID_const,CScript>,std::_Select1st<std::pair<CScriptID_const,CScript>>,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>
                *)&out->scripts,(CScriptID *)&local_a8._M_first,
               (CScript *)&local_58.indirect_contents);
    std::vector<CScript,std::allocator<CScript>>::emplace_back<CScript&>
              ((vector<CScript,std::allocator<CScript>> *)__return_storage_ptr__,
               (CScript *)&local_58.indirect_contents);
    ScriptHash::ScriptHash((ScriptHash *)&local_dc,(CScript *)&local_58.indirect_contents);
    local_a8._M_first._M_storage._M_storage[0x10] = local_cc[0];
    local_a8._M_first._M_storage._M_storage[0x11] = local_cc[1];
    local_a8._M_first._M_storage._M_storage[0x12] = local_cc[2];
    local_a8._M_first._M_storage._M_storage[0x13] = local_cc[3];
    local_a8._0_8_ = local_dc;
    local_a8._M_first._M_storage._M_storage[8] = auStack_d4[0];
    local_a8._M_first._M_storage._M_storage[9] = auStack_d4[1];
    local_a8._M_first._M_storage._M_storage[10] = auStack_d4[2];
    local_a8._M_first._M_storage._M_storage[0xb] = auStack_d4[3];
    local_a8._M_first._M_storage._M_storage[0xc] = auStack_d4[4];
    local_a8._M_first._M_storage._M_storage[0xd] = auStack_d4[5];
    local_a8._M_first._M_storage._M_storage[0xe] = auStack_d4[6];
    local_a8._M_first._M_storage._M_storage[0xf] = auStack_d4[7];
    local_60 = 3;
    GetScriptForDestination
              ((CScript *)&local_c8.indirect_contents,(CTxDestination *)&local_a8._M_first);
    std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
              (__return_storage_ptr__,(CScript *)&local_c8.indirect_contents);
    if (0x1c < local_ac) {
      free(local_c8.indirect_contents.indirect);
      local_c8.indirect_contents.indirect = (char *)0x0;
    }
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_a8._M_first);
    if (0x1c < local_3c) {
      free(local_58.indirect_contents.indirect);
      local_58.indirect_contents.indirect = (char *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript>, FlatSigningProvider& out) const override
    {
        std::vector<CScript> ret;
        CKeyID id = keys[0].GetID();
        out.pubkeys.emplace(id, keys[0]);
        ret.emplace_back(GetScriptForRawPubKey(keys[0])); // P2PK
        ret.emplace_back(GetScriptForDestination(PKHash(id))); // P2PKH
        if (keys[0].IsCompressed()) {
            CScript p2wpkh = GetScriptForDestination(WitnessV0KeyHash(id));
            out.scripts.emplace(CScriptID(p2wpkh), p2wpkh);
            ret.emplace_back(p2wpkh);
            ret.emplace_back(GetScriptForDestination(ScriptHash(p2wpkh))); // P2SH-P2WPKH
        }
        return ret;
    }